

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDetector.cpp
# Opt level: O1

Result * ZXing::Pdf417::Detector::Detect
                   (Result *__return_storage_ptr__,BinaryBitmap *image,bool multiple,bool tryRotate)

{
  list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
  *plVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  bool bVar5;
  BitMatrix *pBVar6;
  undefined **ppuVar7;
  int iVar8;
  shared_ptr<ZXing::BitMatrix> newBits;
  shared_ptr<const_ZXing::BitMatrix> binImg;
  Result result;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  BitMatrix *local_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  uint local_9c;
  undefined1 local_98 [16];
  _func_int **pp_Stack_88;
  undefined **local_80;
  BitMatrix *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  _List_node_base local_68;
  size_t local_58;
  int local_50;
  Result *local_40;
  _func_int **local_38;
  
  pBVar6 = BinaryBitmap::getBitMatrix(image);
  local_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_b0 = pBVar6;
  local_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  (local_a8._M_pi)->_M_use_count = 1;
  (local_a8._M_pi)->_M_weak_count = 1;
  ppuVar7 = &PTR___Sp_counted_base_001f97c8;
  (local_a8._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_001f97c8;
  local_a8._M_pi[1]._vptr__Sp_counted_base = (_func_int **)pBVar6;
  if (local_b0 == (BitMatrix *)0x0) {
    (__return_storage_ptr__->points).
    super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    (__return_storage_ptr__->points).
    super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    (__return_storage_ptr__->bits).
    super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (__return_storage_ptr__->bits).
    super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->points).
    super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
    ._M_impl._M_node._M_size = 0;
    (__return_storage_ptr__->points).
    super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         (_List_node_base *)&__return_storage_ptr__->points;
    (__return_storage_ptr__->points).
    super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
    ._M_impl._M_node.super__List_node_base._M_next =
         (_List_node_base *)&__return_storage_ptr__->points;
    __return_storage_ptr__->rotation = -1;
  }
  else {
    local_78 = (BitMatrix *)0x0;
    _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58 = 0;
    local_50 = -1;
    iVar8 = 0;
    local_38 = (_func_int **)&PTR___Sp_counted_ptr_inplace_001f8d98;
    local_9c = (uint)multiple;
    local_68._M_next = &local_68;
    local_68._M_prev = &local_68;
    local_40 = __return_storage_ptr__;
    do {
      bVar5 = HasStartPattern(local_b0,iVar8 != 0);
      if (bVar5) {
        local_50 = iVar8 * 0x5a;
        if (iVar8 != 0) {
          local_98._0_8_ = *(undefined8 *)local_b0;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_98 + 8),
                     &local_b0->_bits);
          local_b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
          ppuVar7 = local_80;
          (local_b8._M_pi)->_M_use_count = 1;
          (local_b8._M_pi)->_M_weak_count = 1;
          (local_b8._M_pi)->_vptr__Sp_counted_base = local_38;
          pBVar6 = (BitMatrix *)(local_b8._M_pi + 1);
          local_b8._M_pi[1]._vptr__Sp_counted_base = (_func_int **)local_98._0_8_;
          local_b8._M_pi[1]._M_use_count = local_98._8_4_;
          local_b8._M_pi[1]._M_weak_count = local_98._12_4_;
          local_b8._M_pi[2]._vptr__Sp_counted_base = pp_Stack_88;
          *(undefined ***)&local_b8._M_pi[2]._M_use_count = local_80;
          local_98._8_8_ = (_List_node_base *)0x0;
          pp_Stack_88 = (_func_int **)0x0;
          local_80 = (undefined **)0x0;
          BitMatrix::rotate90(pBVar6);
          local_b0 = pBVar6;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&local_a8,&local_b8);
          if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8._M_pi);
          }
        }
        DetectBarcode_abi_cxx11_
                  ((list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
                    *)local_98,(Pdf417 *)local_b0,(BitMatrix *)(ulong)local_9c,SUB81(ppuVar7,0));
        std::__cxx11::
        list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
        ::_M_move_assign((list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
                          *)&local_68,(_List_node_base *)local_98);
        p_Var3 = (_List_node_base *)local_98._0_8_;
        while (p_Var3 != (_List_node_base *)local_98) {
          p_Var2 = (((_List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
                      *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
          operator_delete(p_Var3,0xd0);
          p_Var3 = p_Var2;
        }
        local_78 = local_b0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&_Stack_70,&local_a8);
        if (local_68._M_next == &local_68) {
          local_98._0_8_ = *(undefined8 *)local_b0;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_98 + 8),
                     &local_b0->_bits);
          local_b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
          ppuVar7 = local_80;
          (local_b8._M_pi)->_M_use_count = 1;
          (local_b8._M_pi)->_M_weak_count = 1;
          (local_b8._M_pi)->_vptr__Sp_counted_base = local_38;
          pBVar6 = (BitMatrix *)(local_b8._M_pi + 1);
          local_b8._M_pi[1]._vptr__Sp_counted_base = (_func_int **)local_98._0_8_;
          local_b8._M_pi[1]._M_use_count = local_98._8_4_;
          local_b8._M_pi[1]._M_weak_count = local_98._12_4_;
          local_b8._M_pi[2]._vptr__Sp_counted_base = pp_Stack_88;
          *(undefined ***)&local_b8._M_pi[2]._M_use_count = local_80;
          local_98._8_8_ = (_List_node_base *)0x0;
          pp_Stack_88 = (_func_int **)0x0;
          local_80 = (undefined **)0x0;
          BitMatrix::rotate180(pBVar6);
          DetectBarcode_abi_cxx11_
                    ((list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
                      *)local_98,(Pdf417 *)pBVar6,(BitMatrix *)(ulong)local_9c,SUB81(ppuVar7,0));
          std::__cxx11::
          list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
          ::_M_move_assign((list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
                            *)&local_68,(_List_node_base *)local_98);
          p_Var3 = (_List_node_base *)local_98._0_8_;
          while (p_Var3 != (_List_node_base *)local_98) {
            p_Var2 = p_Var3->_M_next;
            operator_delete(p_Var3,0xd0);
            p_Var3 = p_Var2;
          }
          local_50 = local_50 + 0xb4;
          local_78 = pBVar6;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&_Stack_70,&local_b8);
          if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8._M_pi);
          }
        }
        __return_storage_ptr__ = local_40;
        _Var4._M_pi = _Stack_70._M_pi;
        if (local_68._M_next != &local_68) {
          (local_40->bits).super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          (local_40->bits).super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = local_78;
          (local_40->bits).super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = _Var4._M_pi;
          local_78 = (BitMatrix *)0x0;
          plVar1 = &local_40->points;
          (local_40->points).
          super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
          ._M_impl._M_node.super__List_node_base._M_next = local_68._M_next;
          (local_40->points).
          super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
          ._M_impl._M_node.super__List_node_base._M_prev = local_68._M_prev;
          (local_40->points).
          super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
          ._M_impl._M_node._M_size = local_58;
          (local_68._M_prev)->_M_next = (_List_node_base *)plVar1;
          ((__return_storage_ptr__->points).
           super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
           ._M_impl._M_node.super__List_node_base._M_next)->_M_prev = (_List_node_base *)plVar1;
          local_58 = 0;
          __return_storage_ptr__->rotation = local_50;
          p_Var3 = &local_68;
          local_68._M_next = &local_68;
          local_68._M_prev = &local_68;
          goto joined_r0x00173fc3;
        }
      }
    } while ((iVar8 == 0) && (iVar8 = 1, tryRotate));
    (local_40->points).
    super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    (local_40->points).
    super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    (local_40->bits).super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (local_40->bits).super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (local_40->points).
    super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
    ._M_impl._M_node._M_size = 0;
    (local_40->points).
    super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_40->points;
    (local_40->points).
    super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_40->points;
    local_40->rotation = -1;
    p_Var3 = local_68._M_next;
    __return_storage_ptr__ = local_40;
joined_r0x00173fc3:
    while (p_Var3 != &local_68) {
      p_Var2 = (((_List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
                  *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var3,0xd0);
      p_Var3 = p_Var2;
    }
    if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
    }
  }
  if (local_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

Detector::Result Detector::Detect(const BinaryBitmap& image, bool multiple, bool tryRotate)
{
	// construct a 'dummy' shared pointer, just be able to pass it up the call chain in DetectorResult
	// TODO: reimplement PDF Detector
	auto binImg = std::shared_ptr<const BitMatrix>(image.getBitMatrix(), [](const BitMatrix*){});
	if (!binImg)
		return {};

	Result result;

	for (int rotate90 = 0; rotate90 <= static_cast<int>(tryRotate); ++rotate90) {
		if (!HasStartPattern(*binImg, rotate90))
			continue;

		result.rotation = 90 * rotate90;
		if (rotate90) {
			auto newBits = std::make_shared<BitMatrix>(binImg->copy());
			newBits->rotate90();
			binImg = newBits;
		}

		result.points = DetectBarcode(*binImg, multiple);
		result.bits = binImg;
		if (result.points.empty()) {
			auto newBits = std::make_shared<BitMatrix>(binImg->copy());
			newBits->rotate180();
			result.points = DetectBarcode(*newBits, multiple);
			result.rotation += 180;
			result.bits = newBits;
		}

		if (!result.points.empty())
			return result;
	}

	return {};
}